

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytrieinp.c
# Opt level: O0

void tommy_trie_inplace_list_remove(tommy_trie_inplace_node **let_ptr,tommy_trie_inplace_node *node)

{
  long lVar1;
  tommy_trie_inplace_node *ptVar2;
  long in_FS_OFFSET;
  tommy_trie_inplace_node *head;
  tommy_trie_inplace_node *node_local;
  tommy_trie_inplace_node **let_ptr_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ptVar2 = *let_ptr;
  if (node->next == (tommy_trie_inplace_node_struct *)0x0) {
    ptVar2->prev = node->prev;
  }
  else {
    node->next->prev = node->prev;
  }
  if (ptVar2 == node) {
    *let_ptr = node->next;
  }
  else {
    node->prev->next = node->next;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

tommy_inline void tommy_trie_inplace_list_remove(tommy_trie_inplace_node** let_ptr, tommy_trie_inplace_node* node)
{
	tommy_trie_inplace_node* head = *let_ptr;

	/* remove from the "circular" prev list */
	if (node->next)
		node->next->prev = node->prev;
	else
		head->prev = node->prev; /* the last */

	/* remove from the "0 terminated" next list */
	if (head == node)
		*let_ptr = node->next; /* the new first */
	else
		node->prev->next = node->next;
}